

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O1

void __thiscall
LZ77Compressor::DefaultEncode::operator()
          (DefaultEncode *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,Item item)

{
  pointer *ppuVar1;
  byte bVar2;
  undefined4 uVar3;
  byte *__args;
  iterator iVar4;
  uint8_t b1;
  uint8_t b2;
  byte local_12;
  byte local_11;
  undefined4 local_10;
  ushort local_c;
  
  uVar3 = item._0_4_;
  local_c = item.field_1._2_2_;
  local_10._2_1_ = item.field_1._0_1_;
  local_10 = uVar3;
  if (((uint6)item & 1) == 0) {
    iVar4._M_current =
         (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    bVar2 = local_10._2_1_;
    if (iVar4._M_current ==
        (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __args = (byte *)((long)&local_10 + 2);
      goto LAB_00109d08;
    }
  }
  else {
    local_12 = (byte)(local_c >> 4) & 0xf0 | local_10._2_1_;
    local_11 = item.field_1._2_1_;
    if (this->isSwitch == true) {
      local_12 = local_10._2_1_ << 4 | local_12 >> 4;
    }
    iVar4._M_current =
         (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,iVar4,&local_12);
    }
    else {
      *iVar4._M_current = local_12;
      ppuVar1 = &(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    iVar4._M_current =
         (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    bVar2 = local_11;
    if (iVar4._M_current ==
        (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __args = &local_11;
LAB_00109d08:
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,iVar4,__args);
      return;
    }
  }
  *iVar4._M_current = bVar2;
  ppuVar1 = &(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + 1;
  return;
}

Assistant:

void operator()(std::vector<uint8_t>& out, Item item) {
			if (item.isRepeat) {
				uint8_t b1 = item.length | ((item.offset >> 4) & 0xF0);
				uint8_t b2 = item.offset & 0xFF;
				if (isSwitch) {
					b1 = (b1 >> 4) | (b1 << 4);
				}
				out.push_back(b1);
				out.push_back(b2);
			} else {
				out.push_back(item.value);
			}
		}